

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

uint32_t lua_hash(char *str,uint32_t len)

{
  uint uVar1;
  uint32_t b;
  uint32_t a;
  uint32_t h;
  uint32_t len_local;
  char *str_local;
  
  if (len < 4) {
    if (len == 0) {
      return 0;
    }
    a = (uint32_t)*str;
    b = (uint32_t)str[len >> 1];
    h = (b ^ (int)str[(ulong)len - 1] ^ len) - (b << 0xe | b >> 0x12);
  }
  else {
    a = *(uint32_t *)str;
    uVar1 = *(uint *)(str + ((ulong)(len >> 1) - 2));
    h = (uVar1 ^ *(uint *)(str + ((ulong)len - 4)) ^ len) - (uVar1 << 0xe | uVar1 >> 0x12);
    b = *(int *)(str + ((ulong)(len >> 2) - 1)) + uVar1;
  }
  uVar1 = (h ^ a) - (h << 0xb | h >> 0x15);
  uVar1 = (uVar1 ^ b) - (uVar1 * 0x2000000 | uVar1 >> 7);
  return (uVar1 ^ h) - (uVar1 * 0x10000 | uVar1 >> 0x10);
}

Assistant:

LUA_API uint32_t lua_hash(const char *str, uint32_t len)
{
  uint32_t h = len, a, b;
  if (len >= 4) {
    a = lj_getu32(str);
    h ^= lj_getu32(str+len-4);
    b = lj_getu32(str+(len>>1)-2);
    h ^= b; h -= lj_rol(b, 14);
    b += lj_getu32(str+(len>>2)-1);
  } else if (len > 0) {
    a = *str;
    h ^= *(str+len-1);
    b = *(str+(len>>1));
    h ^= b; h -= lj_rol(b, 14);
  } else {
    return 0;
  }
  a ^= h; a -= lj_rol(h, 11);
  b ^= a; b -= lj_rol(a, 25);
  h ^= b; h -= lj_rol(b, 16);
  return h;
}